

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall
cmFileListGeneratorCaseInsensitive::Search
          (cmFileListGeneratorCaseInsensitive *this,string *parent,cmFileList *lister)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  unsigned_long uVar5;
  char *__s1;
  ulong dindex;
  Directory d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matches;
  Directory DStack_88;
  cmFileListGeneratorCaseInsensitive *local_80;
  string local_78;
  cmFileList *local_58;
  string *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = this;
  local_58 = lister;
  cmsys::Directory::Directory(&DStack_88);
  local_50 = parent;
  cmsys::Directory::Load(&DStack_88,parent);
  dindex = 0;
  while( true ) {
    uVar5 = cmsys::Directory::GetNumberOfFiles(&DStack_88);
    if (uVar5 <= dindex) break;
    __s1 = cmsys::Directory::GetFile(&DStack_88,dindex);
    iVar4 = strcmp(__s1,".");
    bVar2 = false;
    if (iVar4 != 0) {
      iVar4 = strcmp(__s1,"..");
      if (iVar4 != 0) {
        iVar4 = cmsysString_strcasecmp(__s1,(local_80->String)._M_dataplus._M_p);
        if (iVar4 == 0) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          pcVar1 = (local_50->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_78,pcVar1,pcVar1 + local_50->_M_string_length);
          std::__cxx11::string::append((char *)&local_78);
          bVar3 = cmFileListGeneratorBase::Consider
                            (&local_80->super_cmFileListGeneratorBase,&local_78,local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          bVar2 = true;
          if (bVar3) goto LAB_002a6238;
        }
        bVar2 = false;
      }
    }
LAB_002a6238:
    if (bVar2) break;
    dindex = dindex + 1;
  }
  cmsys::Directory::~Directory(&DStack_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return dindex < uVar5;
}

Assistant:

virtual bool Search(std::string const& parent, cmFileList& lister)
    {
    // Look for matching files.
    std::vector<std::string> matches;
    cmsys::Directory d;
    d.Load(parent);
    for(unsigned long i=0; i < d.GetNumberOfFiles(); ++i)
      {
      const char* fname = d.GetFile(i);
      if(strcmp(fname, ".") == 0 ||
         strcmp(fname, "..") == 0)
        {
        continue;
        }
      if(cmsysString_strcasecmp(fname, this->String.c_str()) == 0)
        {
        if(this->Consider(parent + fname, lister))
          {
          return true;
          }
        }
      }
    return false;
    }